

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O0

int aom_uleb_encode(uint64_t value,size_t available,uint8_t *coded_value,size_t *coded_size)

{
  size_t sVar1;
  size_t *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  uint64_t in_RDI;
  uint8_t byte;
  size_t i;
  size_t leb_size;
  undefined1 local_39;
  undefined8 local_38;
  undefined8 local_10;
  undefined4 local_4;
  
  sVar1 = aom_uleb_size_in_bytes(in_RDI);
  if ((((in_RDI < 0x100000000) && (sVar1 < 9)) && (sVar1 <= in_RSI)) &&
     ((CONCAT71(in_register_00000011,in_DL) != 0 && (in_RCX != (size_t *)0x0)))) {
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < sVar1; local_38 = local_38 + 1) {
      local_39 = (byte)local_10 & 0x7f;
      local_10 = local_10 >> 7;
      if (local_10 != 0) {
        local_39 = local_39 | 0x80;
      }
      *(byte *)(CONCAT71(in_register_00000011,in_DL) + local_38) = local_39;
    }
    *in_RCX = sVar1;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int aom_uleb_encode(uint64_t value, size_t available, uint8_t *coded_value,
                    size_t *coded_size) {
  const size_t leb_size = aom_uleb_size_in_bytes(value);
  if (value > kMaximumLeb128Value || leb_size > kMaximumLeb128Size ||
      leb_size > available || !coded_value || !coded_size) {
    return -1;
  }

  for (size_t i = 0; i < leb_size; ++i) {
    uint8_t byte = value & 0x7f;
    value >>= 7;

    if (value != 0) byte |= 0x80;  // Signal that more bytes follow.

    *(coded_value + i) = byte;
  }

  *coded_size = leb_size;
  return 0;
}